

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateFinishStructBuffer
          (KotlinKMPGenerator *this,StructDef *struct_def,string *identifier,CodeWriter *writer,
          IDLOptions *options)

{
  string method_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> gen_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (identifier->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"",(allocator<char> *)&local_88);
  }
  else {
    std::operator+(&local_88,", \"",identifier);
    std::operator+(&local_48,&local_88,"\"");
    std::__cxx11::string::~string((string *)&local_88);
  }
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&local_c8,&this->namer_,struct_def,(ulong)(this->namer_).super_Namer.config_.types);
  std::operator+(&local_a8,"Offset<",&local_c8);
  std::operator+(&local_88,&local_a8,">");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::operator+(&local_a8,"builder: FlatBufferBuilder, offset: ",&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"finish",&local_ea);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68._M_pod_data,"Buffer",&local_e9);
  IdlNamer::LegacyKotlinMethod(&local_c8,&this->namer_,&local_e8,struct_def,(string *)&local_68);
  std::__cxx11::string::~string((string *)local_68._M_pod_data);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_ea);
  local_68._8_8_ = &local_48;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:778:9)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:778:9)>
             ::_M_manager;
  local_68._M_unused._M_object = writer;
  GenerateFunOneLine(writer,&local_c8,&local_a8,&local_e8,(function<void_()> *)&local_68,
                     options->gen_jvmstatic);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void GenerateFinishStructBuffer(StructDef &struct_def,
                                  const std::string &identifier,
                                  CodeWriter &writer,
                                  const IDLOptions options) const {
    auto id = identifier.length() > 0 ? ", \"" + identifier + "\"" : "";
    auto gen_type = "Offset<" + namer_.Type(struct_def.name) + ">";
    auto params = "builder: FlatBufferBuilder, offset: " + gen_type;
    auto method_name =
        namer_.LegacyKotlinMethod("finish", struct_def, "Buffer");
    GenerateFunOneLine(
        writer, method_name, params, "",
        [&]() { writer += "builder.finish(offset" + id + ")"; },
        options.gen_jvmstatic);
  }